

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O2

void __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
::cooperation_data_t::cooperation_data_t
          (cooperation_data_t *this,agent_queue_ref_t *queue,size_t agents,
          prefix_t *data_source_name_prefix,string *coop_name)

{
  (this->m_queue).m_obj = queue->m_obj;
  queue->m_obj = (agent_queue_t *)0x0;
  this->m_agents = agents;
  reuse::thread_pool_stats::make_queue_desc_holder
            ((thread_pool_stats *)&this->m_queue_desc,data_source_name_prefix,coop_name,agents);
  return;
}

Assistant:

cooperation_data_t(
					agent_queue_ref_t queue,
					std::size_t agents,
					const stats::prefix_t & data_source_name_prefix,
					const std::string & coop_name )
					:	m_queue( std::move( queue ) )
					,	m_agents( agents )
					,	m_queue_desc(
							tp_stats::make_queue_desc_holder(
									data_source_name_prefix,
									coop_name,
									agents ) )
					{}